

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uchar * nk_decompress_token(uchar *i)

{
  uchar *local_10;
  uchar *i_local;
  
  if (*i < 0x20) {
    if (*i < 0x18) {
      if (*i < 0x10) {
        if (*i < 8) {
          if (*i == '\a') {
            nk__lit(i + 3,(uint)i[1] * 0x100 + (uint)i[2] + 1);
            local_10 = i + (int)((uint)i[1] * 0x100 + (uint)i[2] + 4);
          }
          else if (*i == '\x06') {
            nk__match(nk__dout +
                      -(ulong)((uint)i[1] * 0x10000 + (uint)i[2] * 0x100 + (uint)i[3] + 1),i[4] + 1)
            ;
            local_10 = i + 5;
          }
          else {
            local_10 = i;
            if (*i == '\x04') {
              nk__match(nk__dout +
                        -(ulong)((uint)i[1] * 0x10000 + (uint)i[2] * 0x100 + (uint)i[3] + 1),
                        (uint)i[4] * 0x100 + (uint)i[5] + 1);
              local_10 = i + 6;
            }
          }
        }
        else {
          nk__lit(i + 2,((uint)*i * 0x100 + (uint)i[1]) - 0x7ff);
          local_10 = i + (int)((uint)*i * 0x100 + (uint)i[1] + -0x7fd);
        }
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*i * 0x10000 + (uint)i[1] * 0x100 + (uint)i[2]) - 0xfffff),
                  (uint)i[3] * 0x100 + (uint)i[4] + 1);
        local_10 = i + 5;
      }
    }
    else {
      nk__match(nk__dout +
                -(ulong)(((uint)*i * 0x10000 + (uint)i[1] * 0x100 + (uint)i[2]) - 0x17ffff),i[3] + 1
               );
      local_10 = i + 4;
    }
  }
  else if (*i < 0x80) {
    if (*i < 0x40) {
      nk__lit(i + 1,*i - 0x1f);
      local_10 = i + (int)(*i - 0x1e);
    }
    else {
      nk__match(nk__dout + -(long)(int)((uint)*i * 0x100 + (uint)i[1] + -0x3fff),i[2] + 1);
      local_10 = i + 3;
    }
  }
  else {
    nk__match(nk__dout + (-1 - (long)(int)(uint)i[1]),*i - 0x7f);
    local_10 = i + 2;
  }
  return local_10;
}

Assistant:

NK_INTERN unsigned char*
nk_decompress_token(unsigned char *i)
{
    #define nk__in2(x)   ((i[x] << 8) + i[(x)+1])
    #define nk__in3(x)   ((i[x] << 16) + nk__in2((x)+1))
    #define nk__in4(x)   ((i[x] << 24) + nk__in3((x)+1))

    if (*i >= 0x20) { /* use fewer if's for cases that expand small */
        if (*i >= 0x80)       nk__match(nk__dout-i[1]-1, (unsigned int)i[0] - 0x80 + 1), i += 2;
        else if (*i >= 0x40)  nk__match(nk__dout-(nk__in2(0) - 0x4000 + 1), (unsigned int)i[2]+1), i += 3;
        else /* *i >= 0x20 */ nk__lit(i+1, (unsigned int)i[0] - 0x20 + 1), i += 1 + (i[0] - 0x20 + 1);
    } else { /* more ifs for cases that expand large, since overhead is amortized */
        if (*i >= 0x18)       nk__match(nk__dout-(unsigned int)(nk__in3(0) - 0x180000 + 1), (unsigned int)i[3]+1), i += 4;
        else if (*i >= 0x10)  nk__match(nk__dout-(unsigned int)(nk__in3(0) - 0x100000 + 1), (unsigned int)nk__in2(3)+1), i += 5;
        else if (*i >= 0x08)  nk__lit(i+2, (unsigned int)nk__in2(0) - 0x0800 + 1), i += 2 + (nk__in2(0) - 0x0800 + 1);
        else if (*i == 0x07)  nk__lit(i+3, (unsigned int)nk__in2(1) + 1), i += 3 + (nk__in2(1) + 1);
        else if (*i == 0x06)  nk__match(nk__dout-(unsigned int)(nk__in3(1)+1), i[4]+1u), i += 5;
        else if (*i == 0x04)  nk__match(nk__dout-(unsigned int)(nk__in3(1)+1), (unsigned int)nk__in2(4)+1u), i += 6;
    }
    return i;
}